

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionController::AddPeginWitness
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,Amount *amount,
          ConfidentialAssetId *asset_id,BlockHash *mainchain_genesis_block_hash,Script *claim_script
          ,ByteData *mainchain_pegin_transaction,ByteData *tx_out_proof)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_datas;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_48;
  
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::Amount::GetByteData((ByteData *)&local_60,amount);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>(&local_48,(ByteData *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  core::ConfidentialAssetId::GetUnblindedData((ByteData *)&local_60,asset_id);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>(&local_48,(ByteData *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  core::BlockHash::GetData((ByteData *)&local_60,mainchain_genesis_block_hash);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_48,(value_type *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  core::Script::GetData((ByteData *)&local_60,claim_script);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_48,(value_type *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_48,mainchain_pegin_transaction);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_48,tx_out_proof);
  AddPeginWitness(this,txid,vout,&local_48);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_48);
  return;
}

Assistant:

void ConfidentialTransactionController::AddPeginWitness(
    const Txid& txid, uint32_t vout, const Amount& amount,
    const ConfidentialAssetId& asset_id,
    const BlockHash& mainchain_genesis_block_hash, const Script& claim_script,
    const ByteData& mainchain_pegin_transaction,
    const ByteData& tx_out_proof) {
  std::vector<ByteData> witness_datas;
  witness_datas.push_back(amount.GetByteData());
  witness_datas.push_back(asset_id.GetUnblindedData());
  witness_datas.push_back(mainchain_genesis_block_hash.GetData());
  witness_datas.push_back(claim_script.GetData());
  witness_datas.push_back(mainchain_pegin_transaction);
  witness_datas.push_back(tx_out_proof);

  AddPeginWitness(txid, vout, witness_datas);
}